

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.hpp
# Opt level: O0

void read<glm::vec<4,float,(glm::qualifier)0>>
               (vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                *v,istream *stream)

{
  istream *piVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  char *__s2;
  vec<4,_float,_(glm::qualifier)0> *pvVar5;
  size_type local_28;
  uint64_t size;
  istream *piStack_18;
  char tag [5];
  istream *stream_local;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  *v_local;
  
  piStack_18 = stream;
  memset((void *)((long)&size + 3),0,5);
  plVar4 = (long *)std::istream::read((char *)piStack_18,(long)&size + 3);
  bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  if (!bVar2) {
    __assert_fail("stream.read(tag, 4) && \"Cannot read input file\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/Serialize.hpp"
                  ,0x84,"void read(std::vector<T> &, std::istream &) [T = glm::vec<4, float>]");
  }
  __s2 = SerializationTraits<glm::vec<4,_float,_(glm::qualifier)0>_>::VectorTag();
  iVar3 = strcmp((char *)((long)&size + 3),__s2);
  if (iVar3 != 0) {
    __assert_fail("!strcmp(tag, SerializationTraits<T>::VectorTag()) && \"read(): Missing vector tag\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/Serialize.hpp"
                  ,0x85,"void read(std::vector<T> &, std::istream &) [T = glm::vec<4, float>]");
  }
  std::istream::read((char *)piStack_18,(long)&local_28);
  swapEndianness(&local_28);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::clear(v);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::resize(v,local_28);
  piVar1 = piStack_18;
  pvVar5 = std::
           vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
           ::data(v);
  std::
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  ::size(v);
  plVar4 = (long *)std::istream::read((char *)piVar1,(long)pvVar5);
  bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  if (!bVar2) {
    __assert_fail("stream.read(reinterpret_cast<char *>(v.data()), v.size() * sizeof(T)) && \"Cannot read vector data from file\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/src/Serialize.hpp"
                  ,0x8d,"void read(std::vector<T> &, std::istream &) [T = glm::vec<4, float>]");
  }
  return;
}

Assistant:

void read(std::vector<T> & v, std::istream & stream)
{
  static_assert(SerializationTraits<T>::IsSerializable, "read(): Vector element type is not serializable");

  // Check TAG
  char tag[5] = {0, 0, 0, 0, 0};
  assert(stream.read(tag, 4) && "Cannot read input file");
  assert(!strcmp(tag, SerializationTraits<T>::VectorTag()) && "read(): Missing vector tag");

  std::uint64_t size;
  stream.read(reinterpret_cast<char *>(&size), sizeof(size));
  swapEndianness(size);

  v.clear();
  v.resize(size);
  assert(stream.read(reinterpret_cast<char *>(v.data()), v.size() * sizeof(T)) && "Cannot read vector data from file");

  if (SerializationTraits<T>::IsEndiannessDependent) {
#ifdef IS_BIG_ENDIAN
    for (T & value : v) {
      swapEndianness(value);
    }
#endif
  }
}